

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_test.cpp
# Opt level: O0

void __thiscall
flatbuffers::tests::ReflectionTest
          (tests *this,string *tests_data_path,uint8_t *flatbuf,size_t length)

{
  bool bVar1;
  return_type expval;
  uint16_t expval_00;
  unsigned_short uVar2;
  uint uVar3;
  BaseType BVar4;
  Offset<flatbuffers::String> root_00;
  SizeT SVar5;
  Offset<const_flatbuffers::Table_*> root_01;
  flatbuffers *this_00;
  uint8_t *puVar6;
  size_t sVar7;
  void *buf;
  Schema *this_01;
  Object *pOVar8;
  String *pSVar9;
  char *pcVar10;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar11;
  return_type pOVar12;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *this_02;
  return_type this_03;
  Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *pVVar13;
  return_type pSVar14;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar15;
  return_type pSVar16;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *this_04;
  Table *pTVar17;
  Type *pTVar18;
  return_type pFVar19;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar20;
  return_type pKVar21;
  return_type this_05;
  Table *table;
  Object *pOVar22;
  int64_t iVar23;
  Struct *pSVar24;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar25;
  _Alloc_hider *__last;
  uchar *puVar26;
  Vector<unsigned_char,_unsigned_int> *pVVar27;
  size_type_conflict sVar28;
  int __c;
  int __c_00;
  Schema *schema_00;
  double dVar29;
  pointer_inside_vector<flatbuffers::Table,_unsigned_char> pVar30;
  pointer_inside_vector<flatbuffers::Vector<unsigned_char,_unsigned_int>,_unsigned_char> pVar31;
  pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
  pVar32;
  undefined1 local_378 [4];
  Offset<const_flatbuffers::Table_*> root_offset;
  FlatBufferBuilder fbb;
  Verifier resize_verifier;
  uint8_t *string_ptr;
  undefined1 local_2a0 [8];
  FlatBufferBuilder stringfbb;
  undefined1 local_218 [8];
  pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
  rtestarrayofstring;
  Field *testarrayofstring_field;
  pointer_inside_vector<flatbuffers::Vector<unsigned_char,_unsigned_int>,_unsigned_char> rinventory;
  Field *inventory_field;
  string local_1e0;
  undefined1 local_1c0 [8];
  pointer_inside_vector<flatbuffers::Table,_unsigned_char> rroot;
  Field *name_field;
  undefined1 local_1a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> resizingbuf;
  return_type test3_object;
  Struct *test3_struct;
  return_type test3_field;
  Struct *pos_struct;
  string hp_string;
  double hp_double;
  int64_t hp_int64;
  unsigned_short hp;
  Table *root;
  return_type pos_table_ptr;
  return_type pos_field_ptr;
  return_type friendly_field_ptr;
  Field *hp_field;
  return_type hp_field_ptr;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *fields;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *fbs2_includes;
  return_type fbs2;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *fbs1_includes;
  return_type fbs1;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *fbs0_includes;
  return_type fbs0;
  Object *root_table;
  Schema *schema;
  Verifier verifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [8];
  string bfbsfile;
  size_t length_local;
  uint8_t *flatbuf_local;
  string *tests_data_path_local;
  
  bfbsfile.field_2._8_8_ = flatbuf;
  std::__cxx11::string::string(local_40);
  std::operator+(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,"monster_test.bfbs");
  this_00 = (flatbuffers *)std::__cxx11::string::c_str();
  bVar1 = LoadFile(this_00,(char *)0x1,SUB81(local_40,0),(string *)length);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"monster_test.bfbs\").c_str(), true, &bfbsfile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x17,"");
  std::__cxx11::string::~string((string *)&local_60);
  puVar6 = (uint8_t *)std::__cxx11::string::c_str();
  sVar7 = std::__cxx11::string::length();
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&schema,puVar6,sVar7,0x40,1000000,true);
  bVar1 = reflection::VerifySchemaBuffer((Verifier *)&schema);
  TestEq<bool,bool>(bVar1,true,"\'reflection::VerifySchemaBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x1c,"");
  buf = (void *)std::__cxx11::string::c_str();
  this_01 = reflection::GetSchema(buf);
  pOVar8 = reflection::Schema::root_table(this_01);
  pSVar9 = reflection::Object::name(pOVar8);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"MyGame.Example.Monster",
            "\'root_table->name()->c_str()\' != \'\"MyGame.Example.Monster\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x23,"");
  pSVar9 = reflection::Object::declaration_file(pOVar8);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"//monster_test.fbs",
            "\'root_table->declaration_file()->c_str()\' != \'\"//monster_test.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x24,"");
  pVVar11 = reflection::Schema::objects(this_01);
  pOVar12 = Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Object>,unsigned_int> *)pVVar11,
                       "TableA");
  pSVar9 = reflection::Object::declaration_file(pOVar12);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"//include_test/include_test1.fbs",
            "\'schema.objects()->LookupByKey(\"TableA\")->declaration_file()->c_str()\' != \'\"//include_test/include_test1.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x27,"");
  pVVar11 = reflection::Schema::objects(this_01);
  pOVar12 = Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Object>,unsigned_int> *)pVVar11,
                       "MyGame.OtherNameSpace.Unused");
  pSVar9 = reflection::Object::declaration_file(pOVar12);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"//include_test/sub/include_test2.fbs",
            "\'schema.objects() ->LookupByKey(\"MyGame.OtherNameSpace.Unused\") ->declaration_file() ->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x2c,"");
  this_02 = reflection::Schema::enums(this_01);
  this_03 = Vector<flatbuffers::Offset<reflection::Enum>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Enum>,unsigned_int> *)this_02,
                       "MyGame.OtherNameSpace.FromInclude");
  pSVar9 = reflection::Enum::declaration_file(this_03);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"//include_test/sub/include_test2.fbs",
            "\'schema.enums() ->LookupByKey(\"MyGame.OtherNameSpace.FromInclude\") ->declaration_file() ->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x31,"");
  pVVar13 = reflection::Schema::fbs_files(this_01);
  uVar3 = Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>::size(pVVar13);
  TestEq<unsigned_int,int>
            (uVar3,3,"\'schema.fbs_files()->size()\' != \'3\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x34,"");
  pVVar13 = reflection::Schema::fbs_files(this_01);
  pSVar14 = Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>::Get(pVVar13,0);
  pSVar9 = reflection::SchemaFile::filename(pSVar14);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"//include_test/include_test1.fbs",
            "\'fbs0->filename()->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x37,"");
  pVVar15 = reflection::SchemaFile::included_filenames(pSVar14);
  uVar3 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::size(pVVar15);
  TestEq<unsigned_int,int>
            (uVar3,2,"\'fbs0_includes->size()\' != \'2\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x39,"");
  pSVar16 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar15,0);
  pcVar10 = String::c_str(pSVar16);
  TestEqStr(pcVar10,"//include_test/include_test1.fbs",
            "\'fbs0_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x3d,"");
  pSVar16 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar15,1);
  pcVar10 = String::c_str(pSVar16);
  TestEqStr(pcVar10,"//include_test/sub/include_test2.fbs",
            "\'fbs0_includes->Get(1)->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x3f,"");
  pVVar13 = reflection::Schema::fbs_files(this_01);
  pSVar14 = Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>::Get(pVVar13,1);
  pSVar9 = reflection::SchemaFile::filename(pSVar14);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"//include_test/sub/include_test2.fbs",
            "\'fbs1->filename()->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x43,"");
  pVVar15 = reflection::SchemaFile::included_filenames(pSVar14);
  uVar3 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::size(pVVar15);
  TestEq<unsigned_int,int>
            (uVar3,2,"\'fbs1_includes->size()\' != \'2\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x45,"");
  pSVar16 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar15,0);
  pcVar10 = String::c_str(pSVar16);
  TestEqStr(pcVar10,"//include_test/include_test1.fbs",
            "\'fbs1_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x47,"");
  pSVar16 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar15,1);
  pcVar10 = String::c_str(pSVar16);
  TestEqStr(pcVar10,"//include_test/sub/include_test2.fbs",
            "\'fbs1_includes->Get(1)->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x49,"");
  pVVar13 = reflection::Schema::fbs_files(this_01);
  pSVar14 = Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>::Get(pVVar13,2);
  pSVar9 = reflection::SchemaFile::filename(pSVar14);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"//monster_test.fbs",
            "\'fbs2->filename()->c_str()\' != \'\"//monster_test.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x4c,"");
  pVVar15 = reflection::SchemaFile::included_filenames(pSVar14);
  uVar3 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::size(pVVar15);
  TestEq<unsigned_int,int>
            (uVar3,1,"\'fbs2_includes->size()\' != \'1\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x4e,"");
  pSVar16 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar15,0);
  pcVar10 = String::c_str(pSVar16);
  TestEqStr(pcVar10,"//include_test/include_test1.fbs",
            "\'fbs2_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x50,"");
  this_04 = reflection::Object::fields(pOVar8);
  pTVar17 = &Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                       ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_04,"hp")
             ->super_Table;
  TestEq<bool,bool>(true,pTVar17 != (Table *)0x0,"\'nullptr\' == \'hp_field_ptr\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x55,"");
  pSVar9 = reflection::Field::name((Field *)pTVar17);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"hp","\'hp_field.name()->c_str()\' != \'\"hp\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x57,"");
  expval_00 = reflection::Field::id((Field *)pTVar17);
  TestEq<unsigned_short,int>
            (expval_00,2,"\'hp_field.id()\' != \'2\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x58,"");
  pTVar18 = reflection::Field::type((Field *)pTVar17);
  BVar4 = reflection::Type::base_type(pTVar18);
  TestEq<reflection::BaseType,reflection::BaseType>
            (BVar4,Short,"\'hp_field.type()->base_type()\' != \'reflection::Short\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x59,"");
  pFVar19 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_04,
                       "friendly");
  TestEq<bool,bool>(true,pFVar19 != (return_type)0x0,"\'nullptr\' == \'friendly_field_ptr\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x5c,"");
  pVVar20 = reflection::Field::attributes(pFVar19);
  TestEq<bool,bool>(true,pVVar20 !=
                         (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0,
                    "\'nullptr\' == \'friendly_field_ptr->attributes()\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x5d,"");
  pVVar20 = reflection::Field::attributes(pFVar19);
  pKVar21 = Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int> *)pVVar20,
                       "priority");
  TestEq<bool,bool>(true,pKVar21 != (return_type)0x0,
                    "\'nullptr\' == \'friendly_field_ptr->attributes()->LookupByKey(\"priority\")\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x5e,"");
  pFVar19 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_04,"pos")
  ;
  TestEq<bool,bool>(true,pFVar19 != (return_type)0x0,"\'nullptr\' == \'pos_field_ptr\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x62,"");
  pTVar18 = reflection::Field::type(pFVar19);
  BVar4 = reflection::Type::base_type(pTVar18);
  pcVar10 = (char *)0xf;
  TestEq<reflection::BaseType,reflection::BaseType>
            (BVar4,Obj,"\'pos_field_ptr->type()->base_type()\' != \'reflection::Obj\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,99,"");
  pVVar11 = reflection::Schema::objects(this_01);
  pTVar18 = reflection::Field::type(pFVar19);
  pcVar10 = reflection::Type::index(pTVar18,pcVar10,__c);
  pOVar12 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                      (pVVar11,(uint)pcVar10);
  TestEq<bool,bool>(true,pOVar12 != (return_type)0x0,"\'nullptr\' == \'pos_table_ptr\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x65,"");
  pSVar9 = reflection::Object::name(pOVar12);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"MyGame.Example.Vec3",
            "\'pos_table_ptr->name()->c_str()\' != \'\"MyGame.Example.Vec3\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x66,"");
  bVar1 = reflection::Field::optional((Field *)pTVar17);
  TestEq<bool,bool>(bVar1,false,"\'hp_field.optional()\' != \'false\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x6a,"");
  bVar1 = reflection::Field::optional(pFVar19);
  TestEq<bool,bool>(bVar1,true,"\'pos_field_ptr->optional()\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x6b,"");
  this_05 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_04,"name"
                      );
  bVar1 = reflection::Field::optional(this_05);
  TestEq<bool,bool>(bVar1,false,"\'fields->LookupByKey(\"name\")->optional()\' != \'false\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x6c,"");
  table = GetAnyRoot((uint8_t *)tests_data_path);
  pOVar22 = reflection::Schema::root_table(this_01);
  bVar1 = flatbuffers::Verify(this_01,pOVar22,(uint8_t *)tests_data_path,bfbsfile.field_2._8_8_,0x40
                              ,1000000);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x73,"");
  uVar2 = GetFieldI<unsigned_short>(table,(Field *)pTVar17);
  TestEq<unsigned_short,int>
            (uVar2,0x50,"\'hp\' != \'80\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x76,"");
  iVar23 = GetAnyFieldI(table,(Field *)pTVar17);
  schema_00 = (Schema *)0x7b;
  TestEq<long,int>(iVar23,0x50,"\'hp_int64\' != \'80\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                   ,0x7b,"");
  hp_string.field_2._8_8_ = GetAnyFieldF(table,(Field *)pTVar17);
  TestEq<double,double>
            ((double)hp_string.field_2._8_8_,80.0,"\'hp_double\' != \'80.0\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x7d,"");
  GetAnyFieldS_abi_cxx11_
            ((string *)&pos_struct,(flatbuffers *)table,pTVar17,(Field *)this_01,schema_00);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar10,"80","\'hp_string.c_str()\' != \'\"80\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x7f,"");
  pSVar24 = GetFieldStruct(table,pFVar19);
  TestEq<bool,bool>(true,pSVar24 != (Struct *)0x0,"\'nullptr\' == \'pos_struct\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x83,"");
  pVVar25 = reflection::Object::fields(pOVar12);
  pFVar19 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)pVVar25,"z");
  dVar29 = GetAnyFieldF(pSVar24,pFVar19);
  TestEq<double,float>
            (dVar29,3.0,
             "\'flatbuffers::GetAnyFieldF(*pos_struct, *pos_table_ptr->fields()->LookupByKey(\"z\"))\' != \'3.0f\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x86,"");
  pVVar25 = reflection::Object::fields(pOVar12);
  pFVar19 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)pVVar25,
                       "test3");
  pSVar24 = GetFieldStruct(pSVar24,pFVar19);
  pcVar10 = (char *)(ulong)(pSVar24 != (Struct *)0x0);
  TestEq<bool,bool>(true,pSVar24 != (Struct *)0x0,"\'nullptr\' == \'test3_struct\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x8a,"");
  pVVar11 = reflection::Schema::objects(this_01);
  pTVar18 = reflection::Field::type(pFVar19);
  pcVar10 = reflection::Type::index(pTVar18,pcVar10,__c_00);
  resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                          (pVVar11,(uint)pcVar10);
  pVVar25 = reflection::Object::fields
                      ((Object *)
                       resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pFVar19 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)pVVar25,"a");
  dVar29 = GetAnyFieldF(pSVar24,pFVar19);
  TestEq<double,int>(dVar29,10,
                     "\'flatbuffers::GetAnyFieldF(*test3_struct, *test3_object->fields()->LookupByKey(\"a\"))\' != \'10\'"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                     ,0x8f,"");
  SetField<unsigned_short>(table,(Field *)pTVar17,200);
  uVar2 = GetFieldI<unsigned_short>(table,(Field *)pTVar17);
  TestEq<unsigned_short,int>
            (uVar2,200,"\'hp\' != \'200\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x94,"");
  SetAnyFieldI(table,(Field *)pTVar17,300);
  iVar23 = GetAnyFieldI(table,(Field *)pTVar17);
  TestEq<long,int>(iVar23,300,"\'hp_int64\' != \'300\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                   ,0x99,"");
  SetAnyFieldF(table,(Field *)pTVar17,300.5);
  iVar23 = GetAnyFieldI(table,(Field *)pTVar17);
  TestEq<long,int>(iVar23,300,"\'hp_int64\' != \'300\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                   ,0x9c,"");
  SetAnyFieldS(table,(Field *)pTVar17,"300");
  iVar23 = GetAnyFieldI(table,(Field *)pTVar17);
  TestEq<long,int>(iVar23,300,"\'hp_int64\' != \'300\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                   ,0x9f,"");
  pOVar22 = reflection::Schema::root_table(this_01);
  bVar1 = flatbuffers::Verify(this_01,pOVar22,(uint8_t *)tests_data_path,bfbsfile.field_2._8_8_,0x40
                              ,1000000);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0xa3,"");
  SetField<unsigned_short>(table,(Field *)pTVar17,0x50);
  __last = &tests_data_path->_M_dataplus + bfbsfile.field_2._8_8_;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&name_field + 7));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a0,
             (uchar *)tests_data_path,(uchar *)__last,
             (allocator<unsigned_char> *)((long)&name_field + 7));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&name_field + 7));
  rroot.vec_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                         ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_04,
                          "name");
  puVar26 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  pTVar17 = GetAnyRoot(puVar26);
  pVar30 = piv<flatbuffers::Table,unsigned_char>
                     (pTVar17,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  rroot.offset_ = (size_t)pVar30.vec_;
  local_1c0 = (undefined1  [8])pVar30.offset_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"totally new string",
             (allocator<char> *)((long)&inventory_field + 7));
  pTVar17 = pointer_inside_vector<flatbuffers::Table,_unsigned_char>::operator*
                      ((pointer_inside_vector<flatbuffers::Table,_unsigned_char> *)local_1c0);
  pSVar9 = GetFieldS(pTVar17,(Field *)rroot.vec_);
  SetString(this_01,&local_1e0,pSVar9,
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,(Object *)0x0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&inventory_field + 7));
  pTVar17 = pointer_inside_vector<flatbuffers::Table,_unsigned_char>::operator*
                      ((pointer_inside_vector<flatbuffers::Table,_unsigned_char> *)local_1c0);
  pSVar9 = GetFieldS(pTVar17,(Field *)rroot.vec_);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"totally new string",
            "\'GetFieldS(**rroot, name_field)->c_str()\' != \'\"totally new string\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0xb5,"");
  rinventory.vec_ =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
       Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                 ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_04,"inventory"
                 );
  pTVar17 = pointer_inside_vector<flatbuffers::Table,_unsigned_char>::operator*
                      ((pointer_inside_vector<flatbuffers::Table,_unsigned_char> *)local_1c0);
  pVVar27 = GetFieldV<unsigned_char>(pTVar17,(Field *)rinventory.vec_);
  pVar31 = piv<flatbuffers::Vector<unsigned_char,unsigned_int>,unsigned_char>
                     (pVVar27,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  rinventory.offset_ = (size_t)pVar31.vec_;
  testarrayofstring_field = (Field *)pVar31.offset_;
  pVVar27 = pointer_inside_vector<flatbuffers::Vector<unsigned_char,_unsigned_int>,_unsigned_char>::
            operator*((pointer_inside_vector<flatbuffers::Vector<unsigned_char,_unsigned_int>,_unsigned_char>
                       *)&testarrayofstring_field);
  ResizeVector<unsigned_char>
            (this_01,0x6e,'2',pVVar27,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,(Object *)0x0);
  pVVar27 = pointer_inside_vector<flatbuffers::Vector<unsigned_char,_unsigned_int>,_unsigned_char>::
            operator->((pointer_inside_vector<flatbuffers::Vector<unsigned_char,_unsigned_int>,_unsigned_char>
                        *)&testarrayofstring_field);
  expval = Vector<unsigned_char,_unsigned_int>::Get(pVVar27,10);
  TestEq<unsigned_char,int>
            (expval,0x32,"\'rinventory->Get(10)\' != \'50\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0xbd,"");
  rtestarrayofstring.vec_ =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
       Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                 ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_04,
                  "testarrayofstring");
  pTVar17 = pointer_inside_vector<flatbuffers::Table,_unsigned_char>::operator*
                      ((pointer_inside_vector<flatbuffers::Table,_unsigned_char> *)local_1c0);
  pVVar15 = GetFieldV<flatbuffers::Offset<flatbuffers::String>>
                      (pTVar17,(Field *)rtestarrayofstring.vec_);
  pVar32 = piv<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>,unsigned_char>
                     (pVVar15,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  rtestarrayofstring.offset_ = (size_t)pVar32.vec_;
  local_218 = (undefined1  [8])pVar32.offset_;
  Offset<flatbuffers::String>::Offset
            ((Offset<flatbuffers::String> *)((long)&stringfbb.string_pool + 4),0);
  pVVar15 = pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
            ::operator*((pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
                         *)local_218);
  ResizeVector<flatbuffers::Offset<flatbuffers::String>>
            (this_01,3,stringfbb.string_pool._4_4_,pVVar15,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,(Object *)0x0);
  sVar7 = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_2a0,0x400,(Allocator *)0x0,false,sVar7);
  root_00 = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                      ((FlatBufferBuilderImpl<false> *)local_2a0,"hank");
  FlatBufferBuilderImpl<false>::Finish<flatbuffers::String>
            ((FlatBufferBuilderImpl<false> *)local_2a0,root_00,(char *)0x0);
  puVar6 = FlatBufferBuilderImpl<false>::GetBufferPointer((FlatBufferBuilderImpl<false> *)local_2a0)
  ;
  SVar5 = FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)local_2a0);
  puVar6 = AddFlatBuffer((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,puVar6,
                         (ulong)SVar5);
  pVVar15 = pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
            ::operator->((pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
                          *)local_218);
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::MutateOffset(pVVar15,2,puVar6);
  pVVar15 = pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
            ::operator->((pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
                          *)local_218);
  pSVar16 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar15,0);
  pcVar10 = String::c_str(pSVar16);
  TestEqStr(pcVar10,"bob","\'rtestarrayofstring->Get(0)->c_str()\' != \'\"bob\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0xd9,"");
  pVVar15 = pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
            ::operator->((pointer_inside_vector<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>,_unsigned_char>
                          *)local_218);
  pSVar16 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar15,2);
  pcVar10 = String::c_str(pSVar16);
  TestEqStr(pcVar10,"hank","\'rtestarrayofstring->Get(2)->c_str()\' != \'\"hank\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0xda,"");
  puVar26 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  sVar28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&fbb.string_pool,puVar26,sVar28,0x40,1000000,true);
  bVar1 = MyGame::Example::VerifyMonsterBuffer((Verifier *)&fbb.string_pool);
  TestEq<bool,bool>(bVar1,true,"\'VerifyMonsterBuffer(resize_verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0xdf,"");
  pOVar22 = reflection::Schema::root_table(this_01);
  puVar26 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  sVar28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  bVar1 = flatbuffers::Verify(this_01,pOVar22,puVar26,sVar28,0x40,1000000);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::Verify(schema, *schema.root_table(), resizingbuf.data(), resizingbuf.size())\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0xe4,"");
  pTVar17 = pointer_inside_vector<flatbuffers::Table,_unsigned_char>::operator*
                      ((pointer_inside_vector<flatbuffers::Table,_unsigned_char> *)local_1c0);
  SetFieldT(pTVar17,(Field *)rroot.vec_,puVar6);
  pTVar17 = pointer_inside_vector<flatbuffers::Table,_unsigned_char>::operator*
                      ((pointer_inside_vector<flatbuffers::Table,_unsigned_char> *)local_1c0);
  pSVar9 = GetFieldS(pTVar17,(Field *)rroot.vec_);
  pcVar10 = String::c_str(pSVar9);
  TestEqStr(pcVar10,"hank","\'GetFieldS(**rroot, name_field)->c_str()\' != \'\"hank\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0xea,"");
  sVar7 = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_378,0x400,(Allocator *)0x0,false,sVar7);
  pTVar17 = GetAnyRoot((uint8_t *)tests_data_path);
  root_01 = CopyTable((FlatBufferBuilder *)local_378,this_01,pOVar8,pTVar17,true);
  pcVar10 = MyGame::Example::MonsterIdentifier();
  FlatBufferBuilderImpl<false>::Finish<flatbuffers::Table_const*>
            ((FlatBufferBuilderImpl<false> *)local_378,root_01,pcVar10);
  puVar6 = FlatBufferBuilderImpl<false>::GetBufferPointer((FlatBufferBuilderImpl<false> *)local_378)
  ;
  SVar5 = FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)local_378);
  AccessFlatBufferTest(puVar6,(ulong)SVar5,true);
  pOVar8 = reflection::Schema::root_table(this_01);
  puVar6 = FlatBufferBuilderImpl<false>::GetBufferPointer((FlatBufferBuilderImpl<false> *)local_378)
  ;
  SVar5 = FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)local_378);
  bVar1 = flatbuffers::Verify(this_01,pOVar8,puVar6,(ulong)SVar5,0x40,1000000);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::Verify(schema, *schema.root_table(), fbb.GetBufferPointer(), fbb.GetSize())\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0xf9,"");
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)local_378);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)local_2a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  std::__cxx11::string::~string((string *)&pos_struct);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ReflectionTest(const std::string &tests_data_path, uint8_t *flatbuf,
                    size_t length) {
  // Load a binary schema.
  std::string bfbsfile;
  TEST_EQ(flatbuffers::LoadFile((tests_data_path + "monster_test.bfbs").c_str(),
                                true, &bfbsfile),
          true);

  // Verify it, just in case:
  flatbuffers::Verifier verifier(
      reinterpret_cast<const uint8_t *>(bfbsfile.c_str()), bfbsfile.length());
  TEST_EQ(reflection::VerifySchemaBuffer(verifier), true);

  // Make sure the schema is what we expect it to be.
  auto &schema = *reflection::GetSchema(bfbsfile.c_str());
  auto root_table = schema.root_table();

  // Check the declaration files.
  TEST_EQ_STR(root_table->name()->c_str(), "MyGame.Example.Monster");
  TEST_EQ_STR(root_table->declaration_file()->c_str(), "//monster_test.fbs");
  TEST_EQ_STR(
      schema.objects()->LookupByKey("TableA")->declaration_file()->c_str(),
      "//include_test/include_test1.fbs");
  TEST_EQ_STR(schema.objects()
                  ->LookupByKey("MyGame.OtherNameSpace.Unused")
                  ->declaration_file()
                  ->c_str(),
              "//include_test/sub/include_test2.fbs");
  TEST_EQ_STR(schema.enums()
                  ->LookupByKey("MyGame.OtherNameSpace.FromInclude")
                  ->declaration_file()
                  ->c_str(),
              "//include_test/sub/include_test2.fbs");

  // Check scheam filenames and their includes.
  TEST_EQ(schema.fbs_files()->size(), 3);

  const auto fbs0 = schema.fbs_files()->Get(0);
  TEST_EQ_STR(fbs0->filename()->c_str(), "//include_test/include_test1.fbs");
  const auto fbs0_includes = fbs0->included_filenames();
  TEST_EQ(fbs0_includes->size(), 2);

  // TODO(caspern): Should we force or disallow inclusion of self?
  TEST_EQ_STR(fbs0_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");
  TEST_EQ_STR(fbs0_includes->Get(1)->c_str(),
              "//include_test/sub/include_test2.fbs");

  const auto fbs1 = schema.fbs_files()->Get(1);
  TEST_EQ_STR(fbs1->filename()->c_str(),
              "//include_test/sub/include_test2.fbs");
  const auto fbs1_includes = fbs1->included_filenames();
  TEST_EQ(fbs1_includes->size(), 2);
  TEST_EQ_STR(fbs1_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");
  TEST_EQ_STR(fbs1_includes->Get(1)->c_str(),
              "//include_test/sub/include_test2.fbs");

  const auto fbs2 = schema.fbs_files()->Get(2);
  TEST_EQ_STR(fbs2->filename()->c_str(), "//monster_test.fbs");
  const auto fbs2_includes = fbs2->included_filenames();
  TEST_EQ(fbs2_includes->size(), 1);
  TEST_EQ_STR(fbs2_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");

  // Check Root table fields
  auto fields = root_table->fields();
  auto hp_field_ptr = fields->LookupByKey("hp");
  TEST_NOTNULL(hp_field_ptr);
  auto &hp_field = *hp_field_ptr;
  TEST_EQ_STR(hp_field.name()->c_str(), "hp");
  TEST_EQ(hp_field.id(), 2);
  TEST_EQ(hp_field.type()->base_type(), reflection::Short);

  auto friendly_field_ptr = fields->LookupByKey("friendly");
  TEST_NOTNULL(friendly_field_ptr);
  TEST_NOTNULL(friendly_field_ptr->attributes());
  TEST_NOTNULL(friendly_field_ptr->attributes()->LookupByKey("priority"));

  // Make sure the table index is what we expect it to be.
  auto pos_field_ptr = fields->LookupByKey("pos");
  TEST_NOTNULL(pos_field_ptr);
  TEST_EQ(pos_field_ptr->type()->base_type(), reflection::Obj);
  auto pos_table_ptr = schema.objects()->Get(pos_field_ptr->type()->index());
  TEST_NOTNULL(pos_table_ptr);
  TEST_EQ_STR(pos_table_ptr->name()->c_str(), "MyGame.Example.Vec3");

  // Test nullability of fields: hp is a 0-default scalar, pos is a struct =>
  // optional, and name is a required string => not optional.
  TEST_EQ(hp_field.optional(), false);
  TEST_EQ(pos_field_ptr->optional(), true);
  TEST_EQ(fields->LookupByKey("name")->optional(), false);

  // Now use it to dynamically access a buffer.
  auto &root = *flatbuffers::GetAnyRoot(flatbuf);

  // Verify the buffer first using reflection based verification
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length),
          true);

  auto hp = flatbuffers::GetFieldI<uint16_t>(root, hp_field);
  TEST_EQ(hp, 80);

  // Rather than needing to know the type, we can also get the value of
  // any field as an int64_t/double/string, regardless of what it actually is.
  auto hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 80);
  auto hp_double = flatbuffers::GetAnyFieldF(root, hp_field);
  TEST_EQ(hp_double, 80.0);
  auto hp_string = flatbuffers::GetAnyFieldS(root, hp_field, &schema);
  TEST_EQ_STR(hp_string.c_str(), "80");

  // Get struct field through reflection
  auto pos_struct = flatbuffers::GetFieldStruct(root, *pos_field_ptr);
  TEST_NOTNULL(pos_struct);
  TEST_EQ(flatbuffers::GetAnyFieldF(*pos_struct,
                                    *pos_table_ptr->fields()->LookupByKey("z")),
          3.0f);

  auto test3_field = pos_table_ptr->fields()->LookupByKey("test3");
  auto test3_struct = flatbuffers::GetFieldStruct(*pos_struct, *test3_field);
  TEST_NOTNULL(test3_struct);
  auto test3_object = schema.objects()->Get(test3_field->type()->index());

  TEST_EQ(flatbuffers::GetAnyFieldF(*test3_struct,
                                    *test3_object->fields()->LookupByKey("a")),
          10);

  // We can also modify it.
  flatbuffers::SetField<uint16_t>(&root, hp_field, 200);
  hp = flatbuffers::GetFieldI<uint16_t>(root, hp_field);
  TEST_EQ(hp, 200);

  // We can also set fields generically:
  flatbuffers::SetAnyFieldI(&root, hp_field, 300);
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);
  flatbuffers::SetAnyFieldF(&root, hp_field, 300.5);
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);
  flatbuffers::SetAnyFieldS(&root, hp_field, "300");
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);

  // Test buffer is valid after the modifications
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length),
          true);

  // Reset it, for further tests.
  flatbuffers::SetField<uint16_t>(&root, hp_field, 80);

  // More advanced functionality: changing the size of items in-line!
  // First we put the FlatBuffer inside an std::vector.
  std::vector<uint8_t> resizingbuf(flatbuf, flatbuf + length);
  // Find the field we want to modify.
  auto &name_field = *fields->LookupByKey("name");
  // Get the root.
  // This time we wrap the result from GetAnyRoot in a smartpointer that
  // will keep rroot valid as resizingbuf resizes.
  auto rroot = flatbuffers::piv(flatbuffers::GetAnyRoot(resizingbuf.data()),
                                resizingbuf);
  SetString(schema, "totally new string", GetFieldS(**rroot, name_field),
            &resizingbuf);
  // Here resizingbuf has changed, but rroot is still valid.
  TEST_EQ_STR(GetFieldS(**rroot, name_field)->c_str(), "totally new string");
  // Now lets extend a vector by 100 elements (10 -> 110).
  auto &inventory_field = *fields->LookupByKey("inventory");
  auto rinventory = flatbuffers::piv(
      flatbuffers::GetFieldV<uint8_t>(**rroot, inventory_field), resizingbuf);
  flatbuffers::ResizeVector<uint8_t>(schema, 110, 50, *rinventory,
                                     &resizingbuf);
  // rinventory still valid, so lets read from it.
  TEST_EQ(rinventory->Get(10), 50);

  // For reflection uses not covered already, there is a more powerful way:
  // we can simply generate whatever object we want to add/modify in a
  // FlatBuffer of its own, then add that to an existing FlatBuffer:
  // As an example, let's add a string to an array of strings.
  // First, find our field:
  auto &testarrayofstring_field = *fields->LookupByKey("testarrayofstring");
  // Find the vector value:
  auto rtestarrayofstring = flatbuffers::piv(
      flatbuffers::GetFieldV<flatbuffers::Offset<flatbuffers::String>>(
          **rroot, testarrayofstring_field),
      resizingbuf);
  // It's a vector of 2 strings, to which we add one more, initialized to
  // offset 0.
  flatbuffers::ResizeVector<flatbuffers::Offset<flatbuffers::String>>(
      schema, 3, 0, *rtestarrayofstring, &resizingbuf);
  // Here we just create a buffer that contans a single string, but this
  // could also be any complex set of tables and other values.
  flatbuffers::FlatBufferBuilder stringfbb;
  stringfbb.Finish(stringfbb.CreateString("hank"));
  // Add the contents of it to our existing FlatBuffer.
  // We do this last, so the pointer doesn't get invalidated (since it is
  // at the end of the buffer):
  auto string_ptr = flatbuffers::AddFlatBuffer(
      resizingbuf, stringfbb.GetBufferPointer(), stringfbb.GetSize());
  // Finally, set the new value in the vector.
  rtestarrayofstring->MutateOffset(2, string_ptr);
  TEST_EQ_STR(rtestarrayofstring->Get(0)->c_str(), "bob");
  TEST_EQ_STR(rtestarrayofstring->Get(2)->c_str(), "hank");
  // Test integrity of all resize operations above.
  flatbuffers::Verifier resize_verifier(
      reinterpret_cast<const uint8_t *>(resizingbuf.data()),
      resizingbuf.size());
  TEST_EQ(VerifyMonsterBuffer(resize_verifier), true);

  // Test buffer is valid using reflection as well
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), resizingbuf.data(),
                              resizingbuf.size()),
          true);

  // As an additional test, also set it on the name field.
  // Note: unlike the name change above, this just overwrites the offset,
  // rather than changing the string in-place.
  SetFieldT(*rroot, name_field, string_ptr);
  TEST_EQ_STR(GetFieldS(**rroot, name_field)->c_str(), "hank");

  // Using reflection, rather than mutating binary FlatBuffers, we can also copy
  // tables and other things out of other FlatBuffers into a FlatBufferBuilder,
  // either part or whole.
  flatbuffers::FlatBufferBuilder fbb;
  auto root_offset = flatbuffers::CopyTable(
      fbb, schema, *root_table, *flatbuffers::GetAnyRoot(flatbuf), true);
  fbb.Finish(root_offset, MonsterIdentifier());
  // Test that it was copied correctly:
  AccessFlatBufferTest(fbb.GetBufferPointer(), fbb.GetSize());

  // Test buffer is valid using reflection as well
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(),
                              fbb.GetBufferPointer(), fbb.GetSize()),
          true);
}